

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall XipFile::TocEntry::~TocEntry(TocEntry *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_XipEntry)._vptr_XipEntry = (_func_int **)&PTR__TocEntry_00146c48;
  p_Var2 = (this->_exe).super___shared_ptr<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var1 = &p_Var2->_M_use_count;
    iVar3 = *p_Var1;
    *p_Var1 = *p_Var1 + -1;
    UNLOCK();
  }
  else {
    iVar3 = p_Var2->_M_use_count;
    p_Var2->_M_use_count = iVar3 + -1;
  }
  if (iVar3 == 1) {
    (*p_Var2->_vptr__Sp_counted_base[2])(p_Var2);
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])(p_Var2);
      return;
    }
  }
  return;
}

Assistant:

TocEntry(uint64_t pos, const uint8_t *pdata)
            : XipEntry(pos)
        {
            _attr= get32le(pdata);
            _filetime= get64le(pdata+0x4);
            _size= get32le(pdata+0xC);
            _rvaname= get32le(pdata+0x10);
            _rvae32= get32le(pdata+0x14);
            _rvao32= get32le(pdata+0x18);
            _rvaload= get32le(pdata+0x1C);
        }